

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlNodeSetPtr xmlXPathNodeTrailingSorted(xmlNodeSetPtr nodes,xmlNodePtr node)

{
  int iVar1;
  xmlNodeSetPtr cur;
  xmlNodePtr val;
  ulong uVar2;
  
  cur = nodes;
  if (node != (xmlNodePtr)0x0) {
    cur = (xmlNodeSetPtr)(*xmlMalloc)(0x10);
    if (cur == (xmlNodeSetPtr)0x0) {
      cur = (xmlNodeSetPtr)0x0;
      xmlXPathErrMemory((xmlXPathContextPtr)0x0,"creating nodeset\n");
    }
    else {
      cur->nodeNr = 0;
      cur->nodeMax = 0;
      cur->nodeTab = (xmlNodePtr *)0x0;
    }
    if (cur == (xmlNodeSetPtr)0x0) {
      cur = (xmlNodeSetPtr)0x0;
    }
    else if ((((nodes != (xmlNodeSetPtr)0x0) && (nodes->nodeNr != 0)) &&
             (nodes->nodeTab != (xmlNodePtr *)0x0)) &&
            (iVar1 = xmlXPathNodeSetContains(nodes,node), iVar1 != 0)) {
      uVar2 = (ulong)(uint)nodes->nodeNr;
      do {
        if ((int)uVar2 < 1) break;
        if (nodes->nodeNr < (int)uVar2) {
          val = (xmlNodePtr)0x0;
        }
        else {
          val = nodes->nodeTab[uVar2 - 1];
        }
        if (val == node) break;
        iVar1 = xmlXPathNodeSetAddUnique(cur,val);
        uVar2 = uVar2 - 1;
      } while (-1 < iVar1);
      libxml_domnode_tim_sort(cur->nodeTab,(long)cur->nodeNr);
    }
  }
  return cur;
}

Assistant:

xmlNodeSetPtr
xmlXPathNodeTrailingSorted (xmlNodeSetPtr nodes, xmlNodePtr node) {
    int i, l;
    xmlNodePtr cur;
    xmlNodeSetPtr ret;

    if (node == NULL)
	return(nodes);

    ret = xmlXPathNodeSetCreate(NULL);
    if (ret == NULL)
        return(ret);
    if (xmlXPathNodeSetIsEmpty(nodes) ||
	(!xmlXPathNodeSetContains(nodes, node)))
	return(ret);

    l = xmlXPathNodeSetGetLength(nodes);
    for (i = l - 1; i >= 0; i--) {
	cur = xmlXPathNodeSetItem(nodes, i);
	if (cur == node)
	    break;
        /* TODO: Propagate memory error. */
	if (xmlXPathNodeSetAddUnique(ret, cur) < 0)
	    break;
    }
    xmlXPathNodeSetSort(ret);	/* bug 413451 */
    return(ret);
}